

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O3

token * ocmesh::details::lex(token *__return_storage_ptr__,istream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char __c;
  int iVar2;
  kind_t kVar3;
  float value;
  char *local_148;
  size_type local_140;
  char local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  size_type *local_108;
  size_type local_100;
  size_type local_f8;
  undefined8 uStack_f0;
  size_type *local_e8;
  size_type local_e0;
  size_type local_d8;
  undefined8 uStack_d0;
  size_type *local_c8;
  size_type local_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  size_type *local_a8;
  size_type local_a0;
  size_type local_98;
  undefined8 uStack_90;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  while( true ) {
    iVar2 = std::istream::peek();
    iVar2 = isspace(iVar2);
    if (iVar2 == 0) break;
    std::istream::get();
  }
  skipcomments(stream);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    __c = std::istream::peek();
    iVar2 = (int)__c;
    if (iVar2 < 0x3b) {
      if (iVar2 == 0x28) {
        std::istream::get();
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"(","");
        __return_storage_ptr__->_kind = lparen;
        paVar1 = &(__return_storage_ptr__->_text).field_2;
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
        if (local_48 == &local_38) {
          paVar1->_M_allocated_capacity = local_38;
          *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_30;
        }
        else {
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_48;
          (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_38;
        }
      }
      else if (iVar2 == 0x29) {
        std::istream::get();
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,")","");
        __return_storage_ptr__->_kind = rparen;
        paVar1 = &(__return_storage_ptr__->_text).field_2;
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
        local_40 = local_60;
        if (local_68 == &local_58) {
          paVar1->_M_allocated_capacity = local_58;
          *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_50;
        }
        else {
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_68;
          (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_58;
        }
      }
      else {
        if (iVar2 != 0x2c) goto LAB_00108d60;
        std::istream::get();
        local_e8 = &local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,",","");
        __return_storage_ptr__->_kind = comma;
        paVar1 = &(__return_storage_ptr__->_text).field_2;
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
        local_40 = local_e0;
        if (local_e8 == &local_d8) {
          paVar1->_M_allocated_capacity = local_d8;
          *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_d0;
        }
        else {
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_e8;
          (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_d8;
        }
      }
    }
    else if (iVar2 < 0x7b) {
      if (iVar2 == 0x3b) {
        std::istream::get();
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,";","");
        __return_storage_ptr__->_kind = semicolon;
        paVar1 = &(__return_storage_ptr__->_text).field_2;
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
        local_40 = local_c0;
        if (local_c8 == &local_b8) {
          paVar1->_M_allocated_capacity = local_b8;
          *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_b0;
        }
        else {
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_c8;
          (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_b8;
        }
      }
      else {
        if (iVar2 != 0x3d) {
LAB_00108d60:
          if (iVar2 - 0x30U < 10 || __c == '-') {
            std::istream::_M_extract<float>((float *)stream);
            __return_storage_ptr__->_kind = number;
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      (&__return_storage_ptr__->_text,vsnprintf,0x3a,"%f",
                       SUB84((double)local_128._M_dataplus._M_p._0_4_,0));
            __return_storage_ptr__->_value = local_128._M_dataplus._M_p._0_4_;
            return __return_storage_ptr__;
          }
          if ((__c != '_') && (iVar2 = isalpha(iVar2), iVar2 == 0)) {
            __return_storage_ptr__->_kind = unknown;
            (__return_storage_ptr__->_text)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->_text).field_2;
            (__return_storage_ptr__->_text).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->_text)._M_string_length = 0;
            __return_storage_ptr__->_value = 0.0;
            return __return_storage_ptr__;
          }
          local_128._M_string_length = 0;
          local_128.field_2._M_local_buf[0] = '\0';
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          while ((__c == '_' || (iVar2 = isalnum((int)__c), iVar2 != 0))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_128,__c);
            std::istream::get();
            __c = std::istream::peek();
          }
          kVar3 = find_keyword(&local_128);
          local_148 = &local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_128._M_dataplus._M_p,
                     local_128._M_dataplus._M_p + local_128._M_string_length);
          __return_storage_ptr__->_kind = kVar3;
          paVar1 = &(__return_storage_ptr__->_text).field_2;
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
          if (local_148 == &local_138) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_137,local_138);
            *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_130;
          }
          else {
            (__return_storage_ptr__->_text)._M_dataplus._M_p = local_148;
            (__return_storage_ptr__->_text).field_2._M_allocated_capacity =
                 CONCAT71(uStack_137,local_138);
          }
          (__return_storage_ptr__->_text)._M_string_length = local_140;
          local_140 = 0;
          local_138 = '\0';
          __return_storage_ptr__->_value = 0.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p == &local_128.field_2) {
            return __return_storage_ptr__;
          }
          local_148 = &local_138;
          operator_delete(local_128._M_dataplus._M_p,
                          CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                   local_128.field_2._M_local_buf[0]) + 1);
          return __return_storage_ptr__;
        }
        std::istream::get();
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"=","");
        __return_storage_ptr__->_kind = equals;
        paVar1 = &(__return_storage_ptr__->_text).field_2;
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
        local_40 = local_100;
        if (local_108 == &local_f8) {
          paVar1->_M_allocated_capacity = local_f8;
          *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_f0;
        }
        else {
          (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_108;
          (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_f8;
        }
      }
    }
    else if (iVar2 == 0x7b) {
      std::istream::get();
      local_88 = &local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"{","");
      __return_storage_ptr__->_kind = lbrace;
      paVar1 = &(__return_storage_ptr__->_text).field_2;
      (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
      local_40 = local_80;
      if (local_88 == &local_78) {
        paVar1->_M_allocated_capacity = local_78;
        *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_70;
      }
      else {
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_88;
        (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_78;
      }
    }
    else {
      if (iVar2 != 0x7d) goto LAB_00108d60;
      std::istream::get();
      local_a8 = &local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"}","");
      __return_storage_ptr__->_kind = rbrace;
      paVar1 = &(__return_storage_ptr__->_text).field_2;
      (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)paVar1;
      local_40 = local_a0;
      if (local_a8 == &local_98) {
        paVar1->_M_allocated_capacity = local_98;
        *(undefined8 *)((long)&(__return_storage_ptr__->_text).field_2 + 8) = uStack_90;
      }
      else {
        (__return_storage_ptr__->_text)._M_dataplus._M_p = (pointer)local_a8;
        (__return_storage_ptr__->_text).field_2._M_allocated_capacity = local_98;
      }
    }
    (__return_storage_ptr__->_text)._M_string_length = local_40;
  }
  else {
    __return_storage_ptr__->_kind = eof;
    (__return_storage_ptr__->_text)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_text).field_2;
    (__return_storage_ptr__->_text).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_text)._M_string_length = 0;
  }
  __return_storage_ptr__->_value = 0.0;
  return __return_storage_ptr__;
}

Assistant:

token lex(std::istream &stream)
    {
        skipwhile(stream, isspace);
        
        skipcomments(stream);
        
        if(stream.eof())
            return token::eof;
        
        // Peek at next character
        char c = stream.peek();
        
        // Lex punctuation
        switch (c) {
            case '(':
                stream.get();
                return token(token::lparen, "(");
            case ')':
                stream.get();
                return token(token::rparen, ")");
            case '{':
                stream.get();
                return token(token::lbrace, "{");
            case '}':
                stream.get();
                return token(token::rbrace, "}");
            case ';':
                stream.get();
                return token(token::semicolon, ";");
            case ',':
                stream.get();
                return token(token::comma, ",");
            case '=':
                stream.get();
                return token(token::equals, "=");
        }
        
        // Lex numbers
        if(c == '-' || std::isdigit(c)) {
            float value;
            stream >> value;
            return token(value);
        }
        
        // Lex identifiers
        if(c == '_' || std::isalpha(c)) {
            std::string id;
            while (c == '_' || std::isalnum(c)) {
                id.push_back(c);
                stream.get();
                c = stream.peek();
            }
            
            return token(find_keyword(id), id);
        }
        
        return token::unknown;
    }